

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O0

Mtbdd __thiscall sylvan::Mtbdd::Abstract(Mtbdd *this,BddSet *variables,mtbdd_abstract_op op)

{
  MTBDD from;
  mtbdd_abstract_op in_RCX;
  mtbdd_abstract_op op_local;
  BddSet *variables_local;
  Mtbdd *this_local;
  
  from = mtbdd_abstract_RUN(*(MTBDD *)variables,*(MTBDD *)op,in_RCX);
  Mtbdd(this,from);
  return (Mtbdd)(MTBDD)this;
}

Assistant:

Mtbdd
Mtbdd::Abstract(const BddSet &variables, mtbdd_abstract_op op) const
{
    return mtbdd_abstract(mtbdd, variables.set.bdd, op);
}